

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_12.cpp
# Opt level: O0

void __thiscall Game::resetGame(Game *this)

{
  vector<int,_std::allocator<int>_> local_30;
  GameResult local_18;
  Game *local_10;
  Game *this_local;
  
  local_10 = this;
  GameResult::GameResult(&local_18,0,0);
  this->gameResult = local_18;
  this->guessCount = 0;
  getReferenceNumbers(&local_30,this);
  std::vector<int,_std::allocator<int>_>::operator=(&this->referenceNumbers,&local_30);
  std::vector<int,_std::allocator<int>_>::~vector(&local_30);
  return;
}

Assistant:

void Game::resetGame()
{
	gameResult = GameResult(0, 0);
	guessCount = 0;
	referenceNumbers = getReferenceNumbers();
}